

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  long *plVar10;
  char **ppcVar11;
  string *this;
  long lVar12;
  long lVar13;
  bool bVar14;
  int maximum_index;
  string data_type;
  string print_format;
  ostringstream error_message_5;
  ifstream ifs;
  int local_428;
  int local_424;
  char *local_420;
  undefined1 *local_418 [2];
  undefined1 local_408 [16];
  undefined8 local_3f8;
  string local_3f0;
  undefined1 *local_3d0;
  char *local_3c8;
  undefined1 local_3c0 [16];
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_424 = -1;
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  local_418[0] = local_408;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"d","");
  local_3f8 = 0;
  local_428 = 0;
  do {
    iVar6 = ya_getopt_long(argc,argv,"l:m:f:h",(option *)0x0,(int *)0x0);
    pcVar3 = local_3c8;
    pcVar1 = ya_optarg;
    switch(iVar6) {
    case 0x66:
      strlen(ya_optarg);
      std::__cxx11::string::_M_replace((ulong)&local_3d0,0,pcVar3,(ulong)pcVar1);
      std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_3d0);
      iVar6 = std::__cxx11::string::compare((char *)&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (iVar6 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -f option must be begin with ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,"%",1);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_001039f3;
      }
      iVar8 = 0;
      break;
    case 0x67:
    case 0x69:
    case 0x6a:
    case 0x6b:
switchD_00103733_caseD_67:
      iVar8 = 1;
      anon_unknown.dwarf_20c1::PrintUsage((ostream *)&std::cerr);
      local_428 = 1;
      break;
    case 0x68:
      anon_unknown.dwarf_20c1::PrintUsage((ostream *)&std::cout);
      local_428 = 0;
      iVar8 = 1;
      break;
    case 0x6c:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar14 = sptk::ConvertStringToInteger(&local_238,&local_424);
      bVar4 = local_424 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar14 || bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_001039f3;
      }
      local_3f8 = 1;
LAB_00103907:
      iVar8 = 0;
      break;
    case 0x6d:
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar4 = sptk::ConvertStringToInteger(&local_238,&local_424);
      bVar14 = -1 < local_424;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (bVar4 && bVar14) {
        local_3f8 = 0;
        goto LAB_00103907;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"non-negative integer",0x14);
      local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
      sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_001039f3:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
        operator_delete(local_3b0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      iVar8 = 1;
      local_428 = 1;
      break;
    default:
      iVar8 = 2;
      if (iVar6 != -1) goto switchD_00103733_caseD_67;
    }
  } while (iVar8 == 0);
  if (iVar8 != 2) goto LAB_00104523;
  bVar4 = argc - ya_optind < 1;
  uVar7 = argc - ya_optind;
  if (uVar7 == 0 || argc < ya_optind) {
    local_420 = (char *)0x0;
  }
  else {
    ppcVar11 = argv + ((long)argc - (ulong)uVar7);
    local_420 = (char *)0x0;
    lVar12 = (ulong)uVar7 + 1;
    do {
      pcVar1 = *ppcVar11;
      if (*pcVar1 == '+') {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        sVar9 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,pcVar1,pcVar1 + sVar9);
        std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_238);
        std::__cxx11::string::operator=((string *)local_418,(string *)local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        bVar14 = true;
      }
      else if (local_420 == (char *)0x0) {
        bVar14 = true;
        local_420 = pcVar1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        local_428 = 1;
        bVar14 = false;
      }
      if (!bVar14) break;
      lVar13 = lVar12 + -1;
      ppcVar11 = ppcVar11 + 1;
      lVar2 = lVar12 + -3;
      bVar4 = lVar13 < 2;
      lVar12 = lVar13;
    } while (SBORROW8(lVar13,2) == lVar2 < 0);
  }
  if (!bVar4) goto LAB_00104523;
  bVar4 = sptk::SetBinaryMode();
  if (!bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"dmp","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
    std::ios_base::~ios_base(local_1c8);
    local_428 = 1;
    goto LAB_00104523;
  }
  this = &local_238;
  std::ifstream::ifstream(this);
  if ((local_420 == (char *)0x0) ||
     (std::ifstream::open((char *)&local_238,(_Ios_Openmode)local_420),
     (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
    cVar5 = std::__basic_file<char>::is_open();
    iVar6 = local_424;
    if (cVar5 == '\0') {
      this = (string *)&std::cin;
    }
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3b0,local_3d0,local_3c8 + (long)local_3d0);
    iVar8 = std::__cxx11::string::compare((char *)local_418);
    if (iVar8 == 0) {
      if (local_3b0[0]._M_string_length == 0) {
        std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d50b);
      }
      plVar10 = (long *)operator_new(0x30);
      *plVar10 = (long)&PTR__DataDump_001129a8;
      plVar10[1] = (long)(plVar10 + 3);
      std::__cxx11::string::_M_construct<char*>
                ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                 local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
LAB_001043f5:
      *(int *)(plVar10 + 5) = (int)local_3f8;
      *(int *)((long)plVar10 + 0x2c) = iVar6;
    }
    else {
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d50b);
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_001129f8;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d50b);
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112a38;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_3b0,0,(char *)0x0,0x10d50b);
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112a78;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%lld");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112ab8;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%u");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112af8;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%u");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112b38;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%u");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112b78;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%u");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112bb8;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%llu");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112bf8;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%g");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112c38;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%g");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112c78;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      iVar8 = std::__cxx11::string::compare((char *)local_418);
      if (iVar8 == 0) {
        if (local_3b0[0]._M_string_length == 0) {
          std::__cxx11::string::operator=((string *)local_3b0,"%Lg");
        }
        plVar10 = (long *)operator_new(0x30);
        *plVar10 = (long)&PTR__DataDump_00112cb8;
        plVar10[1] = (long)(plVar10 + 3);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(plVar10 + 1),local_3b0[0]._M_dataplus._M_p,
                   local_3b0[0]._M_dataplus._M_p + local_3b0[0]._M_string_length);
        goto LAB_001043f5;
      }
      plVar10 = (long *)0x0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
      operator_delete(local_3b0[0]._M_dataplus._M_p);
    }
    if (plVar10 == (long *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"Unexpected argument for the +type option",0x28);
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"dmp","");
      sptk::PrintErrorMessage(&local_3f0,(ostringstream *)local_3b0);
LAB_001044d6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      local_428 = 1;
    }
    else {
      cVar5 = (**(code **)(*plVar10 + 0x10))(plVar10,this);
      local_428 = 0;
      if (cVar5 == '\0') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Failed to dump",0xe);
        local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"dmp","");
        sptk::PrintErrorMessage(&local_3f0,(ostringstream *)local_3b0);
        goto LAB_001044d6;
      }
    }
    if (plVar10 != (long *)0x0) {
      (**(code **)(*plVar10 + 8))(plVar10);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Cannot open file ",0x11);
    pcVar1 = local_420;
    sVar9 = strlen(local_420);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,pcVar1,sVar9);
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"dmp","");
    sptk::PrintErrorMessage(&local_3f0,(ostringstream *)local_3b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
    local_428 = 1;
  }
  std::ifstream::~ifstream(&local_238);
LAB_00104523:
  if (local_418[0] != local_408) {
    operator_delete(local_418[0]);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  return local_428;
}

Assistant:

int main(int argc, char* argv[]) {
  int minimum_index(0);
  int maximum_index(kMagicNumberForEndOfFile);
  std::string print_format("");
  std::string data_type(kDefaultDataType);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:f:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 1;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &maximum_index) ||
            maximum_index < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        minimum_index = 0;
        break;
      }
      case 'f': {
        print_format = optarg;
        if ("%" != print_format.substr(0, 1)) {
          std::ostringstream error_message;
          error_message << "The argument for the -f option must be begin with "
                        << "%";
          sptk::PrintErrorMessage("dmp", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* input_file(NULL);
  for (int i(argc - optind); 1 <= i; --i) {
    const char* arg(argv[argc - i]);
    if (0 == std::strncmp(arg, "+", 1)) {
      const std::string str(arg);
      data_type = str.substr(1, std::string::npos);
    } else if (NULL == input_file) {
      input_file = arg;
    } else {
      std::ostringstream error_message;
      error_message << "Too many input files";
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dmp", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  DataDumpWrapper data_dump(data_type, print_format, minimum_index,
                            maximum_index);

  if (!data_dump.IsValid()) {
    std::ostringstream error_message;
    error_message << "Unexpected argument for the +type option";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  if (!data_dump.Run(&input_stream)) {
    std::ostringstream error_message;
    error_message << "Failed to dump";
    sptk::PrintErrorMessage("dmp", error_message);
    return 1;
  }

  return 0;
}